

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool duckdb_je_tcache_bin_ncached_max_read(tsd_t *tsd,size_t bin_size,cache_bin_sz_t *ncached_max)

{
  cache_bin_sz_t cVar1;
  uint uVar2;
  
  if (0x800000 < bin_size) goto LAB_011a4e82;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
    if (bin_size < 0x1001) {
      uVar2 = (uint)duckdb_je_sz_size2index_tab[bin_size + 7 >> 3];
    }
    else {
      uVar2 = sz_size2index_compute(bin_size);
    }
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar2].stack_head
        == (void **)&duckdb_je_disabled_bin) goto LAB_011a4e7c;
    cVar1 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar2].bin_info
            .ncached_max;
  }
  else {
LAB_011a4e7c:
    cVar1 = 0;
  }
  *ncached_max = cVar1;
LAB_011a4e82:
  return 0x800000 < bin_size;
}

Assistant:

bool
tcache_bin_ncached_max_read(tsd_t *tsd, size_t bin_size,
    cache_bin_sz_t *ncached_max) {
	if (bin_size > TCACHE_MAXCLASS_LIMIT) {
		return true;
	}

	if (!tcache_available(tsd)) {
		*ncached_max = 0;
		return false;
	}

	tcache_t *tcache = tsd_tcachep_get(tsd);
	assert(tcache != NULL);
	szind_t bin_ind = sz_size2index(bin_size);

	cache_bin_t *bin = &tcache->bins[bin_ind];
	*ncached_max = tcache_bin_disabled(bin_ind, bin, tcache->tcache_slow) ?
	    0: cache_bin_ncached_max_get(bin);
	return false;
}